

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_try::translate
          (method_try *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  compiler_type *this_00;
  _Elt_pointer pdVar1;
  bool bVar2;
  int iVar3;
  statement_try *this_01;
  _Elt_pointer pptVar4;
  compile_error *this_02;
  iterator *ast;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_03;
  statement_base **ptr;
  iterator *__x;
  _Elt_pointer ppsVar5;
  allocator local_291;
  _Map_pointer local_290;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *local_288;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_280;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_278;
  string name;
  string local_248;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> tbody;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  string local_188;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> cbody;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_118;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map_size =
       (size_t)(raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_first;
  cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  local_288 = &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
  std::operator+(&local_50,(_Self *)&cbody,1);
  local_78._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_78._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_280 = raw;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&tbody,&local_50,&local_78,(allocator_type *)&name);
  ast = (iterator *)&tbody;
  compiler_type::translate
            (this_00,(deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)ast,&body);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&tbody);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&tbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  local_290 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
  bVar2 = false;
  __x = (iterator *)
        body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  ppsVar5 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  while (__x != (iterator *)
                body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    iVar3 = (*(code *)((iterator *)
                      ((long)&((*(((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                                    *)&__x->_M_cur)->_M_impl).super__Deque_impl_data._M_map)->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data + 0x10))->_M_cur)();
    if (iVar3 == 0x1b) {
      ast = (iterator *)
            ((((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)&__x->_M_cur)->_M_impl).super__Deque_impl_data._M_map + 4);
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&name);
    }
    else {
      this_03 = &tbody.
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>;
      if (bVar2) {
        this_03 = &cbody.
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>;
      }
      ast = __x;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_03,
                 (value_type *)__x);
    }
    __x = (iterator *)&__x->_M_first;
    if (__x == (iterator *)ppsVar5) {
      __x = (iterator *)local_290[1];
      local_290 = local_290 + 1;
      ppsVar5 = (_Elt_pointer)(__x + 0x10);
    }
  }
  if (bVar2) {
    this_01 = (statement_try *)statement_base::operator_new((statement_base *)0xe0,(size_t)ast);
    std::__cxx11::string::string((string *)&local_248,(string *)&name);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
               &tbody);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_118,
               &cbody);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_278,local_288);
    pdVar1 = (local_280->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar4 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar4 ==
        (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar4 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_try::statement_try
              (this_01,&local_248,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_118,
               (context_t *)&local_278,pptVar4[-1]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_118);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_c8);
    std::__cxx11::string::~string((string *)&local_248);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&cbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
              );
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&tbody.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
              );
    std::__cxx11::string::~string((string *)&name);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    return &this_01->super_statement_base;
  }
  this_02 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_188,"Wrong grammar for try statement, expect catch statement.",
             &local_291);
  compile_error::compile_error(this_02,&local_188);
  __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_try::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		std::string name;
		std::deque<statement_base *> tbody, cbody;
		bool founded = false;
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::catch_) {
				name = static_cast<statement_catch *>(ptr)->get_name();
				founded = true;
				continue;
			}
			if (founded)
				cbody.push_back(ptr);
			else
				tbody.push_back(ptr);
		}
		if (!founded)
			throw compile_error("Wrong grammar for try statement, expect catch statement.");
		return new statement_try(name, tbody, cbody, context, raw.front().back());
	}